

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cc
# Opt level: O0

int tchecker::zg::path::concrete::lexical_cmp(edge_t *e1,edge_t *e2)

{
  bool bVar1;
  undefined1 local_48 [8];
  clock_rational_value_t d2;
  clock_rational_value_t d1;
  int cmp;
  edge_t *e2_local;
  edge_t *e1_local;
  
  e1_local._4_4_ = symbolic::lexical_cmp(&e1->super_edge_t,&e2->super_edge_t);
  if (e1_local._4_4_ == 0) {
    join_0x00000010_0x00000000_ = edge_t::delay(e1);
    _local_48 = edge_t::delay(e2);
    bVar1 = boost::rational<long>::operator<((rational<long> *)&d2.den,(rational<long> *)local_48);
    if (bVar1) {
      e1_local._4_4_ = -1;
    }
    else {
      bVar1 = boost::rational<long>::operator>((rational<long> *)&d2.den,(rational<long> *)local_48)
      ;
      if (bVar1) {
        e1_local._4_4_ = 1;
      }
      else {
        e1_local._4_4_ = 0;
      }
    }
  }
  return e1_local._4_4_;
}

Assistant:

int lexical_cmp(tchecker::zg::path::concrete::edge_t const & e1, tchecker::zg::path::concrete::edge_t const & e2)
{
  int cmp = tchecker::zg::path::symbolic::lexical_cmp(e1, e2);
  if (cmp != 0)
    return cmp;
  tchecker::clock_rational_value_t const d1 = e1.delay(), d2 = e2.delay();
  if (d1 < d2)
    return -1;
  if (d1 > d2)
    return 1;
  return 0;
}